

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entdec.c
# Opt level: O2

int od_ec_decode_bool_q15(od_ec_dec *dec,uint f)

{
  uint uVar1;
  uint uVar2;
  uint ret;
  uint rng;
  bool bVar3;
  
  uVar1 = dec->dif;
  ret = ((uint)(dec->rng >> 8) * (f >> 6) >> 1) + 4;
  uVar2 = ret * 0x10000;
  rng = dec->rng - ret;
  bVar3 = uVar1 < uVar2;
  if (bVar3) {
    rng = ret;
    uVar2 = 0;
  }
  od_ec_dec_normalize(dec,uVar1 - uVar2,rng,ret);
  return (int)bVar3;
}

Assistant:

int od_ec_decode_bool_q15(od_ec_dec *dec, unsigned f) {
  od_ec_window dif;
  od_ec_window vw;
  unsigned r;
  unsigned r_new;
  unsigned v;
  int ret;
  assert(0 < f);
  assert(f < 32768U);
  dif = dec->dif;
  r = dec->rng;
  assert(dif >> (OD_EC_WINDOW_SIZE - 16) < r);
  assert(32768U <= r);
  v = ((r >> 8) * (uint32_t)(f >> EC_PROB_SHIFT) >> (7 - EC_PROB_SHIFT));
  v += EC_MIN_PROB;
  vw = (od_ec_window)v << (OD_EC_WINDOW_SIZE - 16);
  ret = 1;
  r_new = v;
  if (dif >= vw) {
    r_new = r - v;
    dif -= vw;
    ret = 0;
  }
  return od_ec_dec_normalize(dec, dif, r_new, ret);
}